

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void DrawerCommandQueue::QueueCommand<swrenderer::DrawFuzzColumnPalCommand>(void)

{
  DrawerCommandQueue *this;
  DrawFuzzColumnPalCommand *this_00;
  DrawFuzzColumnPalCommand command;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    swrenderer::DrawFuzzColumnPalCommand::DrawFuzzColumnPalCommand(&command);
    VectoredTryCatch(&command,QueueCommand<swrenderer::DrawFuzzColumnPalCommand>::
                              anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::DrawFuzzColumnPalCommand>::anon_class_1_0_00000001::
                     __invoke);
  }
  else {
    this_00 = (DrawFuzzColumnPalCommand *)AllocMemory(0x30);
    if (this_00 == (DrawFuzzColumnPalCommand *)0x0) {
      Finish(this);
      this_00 = (DrawFuzzColumnPalCommand *)AllocMemory(0x30);
      if (this_00 == (DrawFuzzColumnPalCommand *)0x0) {
        return;
      }
    }
    swrenderer::DrawFuzzColumnPalCommand::DrawFuzzColumnPalCommand(this_00);
    command.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
    std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::emplace_back<DrawerCommand*>
              ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,
               (DrawerCommand **)&command);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}